

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_filter.cpp
# Opt level: O0

uint64_t * read_data(char *filename,size_t *array_size,size_t maxline,bool printall)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  FILE *__stream;
  clock_t cVar6;
  ulong uVar7;
  clock_t cVar8;
  __off_t _Var9;
  byte in_CL;
  ulong in_RDX;
  ulong *in_RSI;
  char *in_RDI;
  size_t numberofbytes;
  clock_t end;
  uint64_t hexval;
  uint64_t *newarray;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  clock_t start;
  FILE *fp;
  uint64_t *array;
  size_t array_capacity;
  int read;
  size_t line_capacity;
  char *line;
  uint64_t *local_50;
  ulong local_48;
  size_t local_38;
  uint8_t *local_30;
  byte local_21;
  ulong local_20;
  ulong *local_18;
  char *local_10;
  uint64_t *local_8;
  
  local_21 = in_CL & 1;
  local_30 = (uint8_t *)0x0;
  local_38 = 0;
  local_48 = 0x25800000;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_50 = (uint64_t *)malloc(0x12c000000);
  if (local_50 == (uint64_t *)0x0) {
    printf("Cannot allocate memory. Use a machine with plenty of RAM.");
    local_8 = (uint64_t *)0x0;
  }
  else {
    *local_18 = 0;
    __stream = fopen(local_10,"r");
    if (__stream == (FILE *)0x0) {
      printf("Cannot read the input file %s.",local_10);
      free(local_50);
      local_8 = (uint64_t *)0x0;
    }
    else {
      cVar6 = clock();
      while( true ) {
        uVar7 = getline((char **)&local_30,&local_38,__stream);
        if ((int)uVar7 == -1) break;
        if ((int)uVar7 < 0x10) {
          printf("\r%256s","");
          fflush((FILE *)0x0);
          printf("Skipping line %s since it is too short (%d)\n",local_30,uVar7 & 0xffffffff);
        }
        else {
          uVar2 = hex_to_u32_nocheck(local_30);
          uVar3 = hex_to_u32_nocheck(local_30 + 4);
          uVar4 = hex_to_u32_nocheck(local_30 + 8);
          uVar5 = hex_to_u32_nocheck(local_30 + 0xc);
          if ((uVar2 | uVar3 | uVar4 | uVar5) < 0x10000) {
            if (local_48 <= *local_18) {
              local_48 = (*local_18 * 3 >> 1) + 0x40;
              local_50 = (uint64_t *)realloc(local_50,local_48);
              if (local_50 == (uint64_t *)0x0) {
                printf("Reallocation failed. Aborting.\n");
                return (uint64_t *)0x0;
              }
            }
            uVar7 = (ulong)uVar2 << 0x30 | (ulong)uVar3 << 0x20 | (ulong)uVar4 << 0x10 |
                    (ulong)uVar5;
            if ((local_21 & 1) != 0) {
              printf("hexval = 0x%lx\n",uVar7);
            }
            uVar1 = *local_18;
            *local_18 = uVar1 + 1;
            local_50[uVar1] = uVar7;
            if ((*local_18 != 0) && (*local_18 % 1000000 == 0)) {
              printf("\rread %zu hashes.",*local_18);
            }
            if (*local_18 == local_20) {
              printf("Reached the maximum number of lines %zu.\n",local_20);
              break;
            }
            fflush((FILE *)0x0);
          }
          else {
            printf("\r%256s","");
            fflush((FILE *)0x0);
            printf("Skipping line %s since it does not start with an hexadecimal\n",local_30);
          }
        }
      }
      cVar8 = clock();
      free(local_30);
      _Var9 = ftello(__stream);
      fclose(__stream);
      printf("\rI read %zu hashes in total (%.3f seconds).\n",
             (double)((float)(cVar8 - cVar6) / 1e+06),*local_18);
      printf("Bytes read = %zu.\n",_Var9);
      local_8 = local_50;
    }
  }
  return local_8;
}

Assistant:

uint64_t *read_data(const char *filename, size_t &array_size, size_t maxline,
                    bool printall) {
  char *line = NULL;
  size_t line_capacity = 0;
  int read;

  size_t array_capacity = 600 * 1024 * 1024;
  uint64_t *array = (uint64_t *)malloc(array_capacity * sizeof(uint64_t));
  if (array == NULL) {
    printf("Cannot allocate memory. Use a machine with plenty of RAM.");
    return nullptr;
  }
  array_size = 0;

  FILE *fp = fopen(filename, "r");
  if (fp == NULL) {
    printf("Cannot read the input file %s.", filename);
    free(array);
    return nullptr;
  }
  clock_t start = clock();

  while ((read = getline(&line, &line_capacity, fp)) != -1) {
    if (read < 16) {
      printf("\r%256s", "");
      fflush(NULL);
      printf("Skipping line %s since it is too short (%d)\n", line, read);
      continue;
    }
    uint64_t x1 = hex_to_u32_nocheck((const uint8_t *)line);
    uint64_t x2 = hex_to_u32_nocheck((const uint8_t *)line + 4);
    uint64_t x3 = hex_to_u32_nocheck((const uint8_t *)line + 8);
    uint64_t x4 = hex_to_u32_nocheck((const uint8_t *)line + 12);
    if ((x1 | x2 | x3 | x4) > 0xFFFF) {
      printf("\r%256s", "");
      fflush(NULL);
      printf("Skipping line %s since it does not start with an hexadecimal\n",
             line);
      continue;
    }
    if (array_size >= array_capacity) {
      array_capacity = 3 * array_size / 2 + 64;
      uint64_t *newarray = (uint64_t *)realloc(array, array_capacity);
      if (newarray == NULL) {
        printf("Reallocation failed. Aborting.\n");
        return nullptr;
      }
      array = newarray;
    }
    uint64_t hexval = (x1 << 48) | (x2 << 32) | (x3 << 16) | x4;
    if (printall)
      printf("hexval = 0x%" PRIx64 "\n", hexval);
    array[array_size++] = hexval;
    if ((array_size > 0) && ((array_size % 1000000) == 0)) {
      printf("\rread %zu hashes.", array_size);
    }
    if (array_size == maxline) {
      printf("Reached the maximum number of lines %zu.\n", maxline);
      break;
    }
    fflush(NULL);
  }
  clock_t end = clock();
  free(line);
  size_t numberofbytes = ftello(fp);
  fclose(fp);

  printf("\rI read %zu hashes in total (%.3f seconds).\n", array_size,
         (float)(end - start) / CLOCKS_PER_SEC);
  printf("Bytes read = %zu.\n", numberofbytes);
  return array;
}